

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_Mesh * __thiscall
ON_Mesh::CopyComponents
          (ON_Mesh *this,ON_COMPONENT_INDEX *ci_list,size_t ci_count,ON_Mesh *destination_mesh)

{
  ON_3fVector *pOVar1;
  ON_3fPoint *pOVar2;
  ON_3dPoint *pOVar3;
  uint uVar4;
  float fVar5;
  bool bVar6;
  uint mesh_vertex_count;
  uint count;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ON_MeshTopologyVertex *pOVar10;
  ON_MeshTopologyEdge *pOVar11;
  ON_MeshFace *pOVar12;
  ON_MeshFace *pOVar13;
  ON_MeshFace *pOVar14;
  ON_3fVector *pOVar15;
  ON_3fPoint *pOVar16;
  ON_3dPoint *pOVar17;
  ON_2dPoint *pOVar18;
  ON_2fPoint *pOVar19;
  ON_SurfaceCurvature *pOVar20;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar21;
  ON_MeshNgon *pOVar22;
  ON_MeshNgon *ngon_00;
  uint *puVar23;
  ulong uVar24;
  ON_Color *local_340;
  ON_SurfaceCurvature *local_328;
  ON_2fPoint *local_310;
  ON_3fVector *local_2f8;
  ON_2dPoint *local_2e0;
  ON_3dPoint *local_2c8;
  ON_3fPoint *local_2b0;
  ON_3fVector *local_280;
  uint local_1f8;
  uint local_1f4;
  ON_MeshTopology *local_1f0;
  ON_MeshNgon *ngon1;
  uint j_2;
  ON_MeshNgon *ngon_1;
  uint ngon_index;
  uint ngon_count;
  ON_Color *C;
  ON_SurfaceCurvature *K;
  ON_2fPoint *T;
  ON_3fVector *N;
  ON_2dPoint *S;
  ON_3dPoint *dV;
  bool bValidDoubles;
  ON_3fPoint *fV;
  bool bValidSingles;
  uint *fvi1;
  uint *fvi;
  ON_3fVector *FN;
  ON_MeshFace *F;
  ON_Mesh *mesh_copy;
  uint vertex_count1;
  int iStack_144;
  ON_MeshFace f;
  uint face_count1;
  int j_1;
  ON_MeshTopologyEdge *e;
  int j;
  ON_MeshTopologyVertex *v;
  ON_MeshNgon *ngon;
  ON_COMPONENT_INDEX ci;
  size_t ci_index;
  undefined1 local_e8 [8];
  ON_MeshNgonBuffer ngon_buffer;
  uint local_90;
  uint vi;
  uint fi;
  uint i;
  uint *face_map;
  uint *vertex_map;
  ON_SimpleArray<unsigned_int> face_map_buffer;
  ON_SimpleArray<unsigned_int> vertex_map_buffer;
  uint tope_count;
  uint topv_count;
  ON_MeshTopology *top;
  uint face_count;
  uint vertex_count;
  ON_Mesh *destination_mesh_local;
  size_t ci_count_local;
  ON_COMPONENT_INDEX *ci_list_local;
  ON_Mesh *this_local;
  
  if ((ci_count == 0) || (ci_list == (ON_COMPONENT_INDEX *)0x0)) {
    this_local = (ON_Mesh *)0x0;
  }
  else {
    mesh_vertex_count =
         ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
    count = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&this->m_F);
    if ((mesh_vertex_count == 0) && (count == 0)) {
      this_local = (ON_Mesh *)0x0;
    }
    else {
      bVar6 = TopologyExists(this);
      if (bVar6) {
        local_1f0 = Topology(this);
      }
      else {
        local_1f0 = (ON_MeshTopology *)0x0;
      }
      if (local_1f0 == (ON_MeshTopology *)0x0) {
        local_1f4 = 0;
        local_1f8 = 0;
      }
      else {
        local_1f4 = ON_SimpleArray<ON_MeshTopologyVertex>::UnsignedCount(&local_1f0->m_topv);
        local_1f8 = ON_SimpleArray<ON_MeshTopologyEdge>::UnsignedCount(&local_1f0->m_tope);
      }
      ON_SimpleArray<unsigned_int>::ON_SimpleArray
                ((ON_SimpleArray<unsigned_int> *)&face_map_buffer.m_count);
      ON_SimpleArray<unsigned_int>::ON_SimpleArray((ON_SimpleArray<unsigned_int> *)&vertex_map);
      face_map = (uint *)0x0;
      _fi = (uint *)0x0;
      ON_MeshNgonBuffer::ON_MeshNgonBuffer((ON_MeshNgonBuffer *)local_e8);
      ci.m_type = invalid_type;
      ci.m_index = 0;
      for (; (ulong)ci < ci_count; ci = (ON_COMPONENT_INDEX)((long)ci + 1)) {
        ngon = *(ON_MeshNgon **)(ci_list + (long)ci);
        bVar6 = ON_COMPONENT_INDEX::IsMeshComponentIndex((ON_COMPONENT_INDEX *)&ngon);
        if ((bVar6) && (uVar8 = ngon._4_4_, -1 < (long)ngon)) {
          switch(ngon._0_4_) {
          case 0xb:
            if (ngon._4_4_ < mesh_vertex_count) {
              if (face_map == (uint *)0x0) {
                face_map = InitializeMap(mesh_vertex_count,
                                         (ON_SimpleArray<unsigned_int> *)&face_map_buffer.m_count);
              }
              face_map[uVar8] = 0;
            }
            break;
          case 0xc:
            if ((ngon._4_4_ < local_1f4) &&
               (pOVar10 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[]
                                    (&local_1f0->m_topv,ngon._4_4_), pOVar10->m_vi != (int *)0x0)) {
              for (e._4_4_ = 0; e._4_4_ < pOVar10->m_v_count; e._4_4_ = e._4_4_ + 1) {
                if ((-1 < pOVar10->m_vi[e._4_4_]) &&
                   (ngon_buffer.m_ngon_buffer[9]._4_4_ = pOVar10->m_vi[e._4_4_],
                   ngon_buffer.m_ngon_buffer[9]._4_4_ < mesh_vertex_count)) {
                  if (face_map == (uint *)0x0) {
                    face_map = InitializeMap(mesh_vertex_count,
                                             (ON_SimpleArray<unsigned_int> *)
                                             &face_map_buffer.m_count);
                  }
                  face_map[ngon_buffer.m_ngon_buffer[9]._4_4_] = 0;
                }
              }
            }
            break;
          case 0xd:
            if ((ngon._4_4_ < local_1f8) &&
               (pOVar11 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[]
                                    (&local_1f0->m_tope,ngon._4_4_), pOVar11->m_topfi != (int *)0x0)
               ) {
              for (f.vi[3] = 0; f.vi[3] < pOVar11->m_topf_count; f.vi[3] = f.vi[3] + 1) {
                if ((-1 < pOVar11->m_topfi[f.vi[3]]) &&
                   (uVar8 = pOVar11->m_topfi[f.vi[3]], uVar8 < count)) {
                  if (_fi == (uint *)0x0) {
                    _fi = InitializeMap(count,(ON_SimpleArray<unsigned_int> *)&vertex_map);
                  }
                  _fi[uVar8] = 0;
                }
              }
            }
            break;
          case 0xe:
          case 0xf:
            pOVar22 = NgonFromComponentIndex
                                (this,(ON_MeshNgonBuffer *)local_e8,(ON_COMPONENT_INDEX)ngon);
            if (pOVar22 != (ON_MeshNgon *)0x0) {
              if (pOVar22->m_vi != (uint *)0x0) {
                for (vi = 0; vi < pOVar22->m_Vcount; vi = vi + 1) {
                  ngon_buffer.m_ngon_buffer[9]._4_4_ = pOVar22->m_vi[vi];
                  if (ngon_buffer.m_ngon_buffer[9]._4_4_ < mesh_vertex_count) {
                    if (face_map == (uint *)0x0) {
                      face_map = InitializeMap(mesh_vertex_count,
                                               (ON_SimpleArray<unsigned_int> *)
                                               &face_map_buffer.m_count);
                    }
                    face_map[ngon_buffer.m_ngon_buffer[9]._4_4_] = 0;
                  }
                }
              }
              if (pOVar22->m_fi != (uint *)0x0) {
                for (vi = 0; vi < pOVar22->m_Fcount; vi = vi + 1) {
                  uVar8 = pOVar22->m_fi[vi];
                  if (uVar8 < count) {
                    if (_fi == (uint *)0x0) {
                      _fi = InitializeMap(count,(ON_SimpleArray<unsigned_int> *)&vertex_map);
                    }
                    _fi[uVar8] = 0;
                  }
                }
              }
            }
          }
        }
      }
      f.vi[2] = 0;
      if (_fi != (uint *)0x0) {
        for (vi = 0; vi < count; vi = vi + 1) {
          if (_fi[vi] == 0) {
            pOVar12 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,vi);
            _vertex_count1 = *(undefined8 *)pOVar12->vi;
            f.vi._0_8_ = *(undefined8 *)(pOVar12->vi + 2);
            bVar6 = ON_MeshFace::IsValid((ON_MeshFace *)&vertex_count1,mesh_vertex_count);
            if (bVar6) {
              iVar7 = f.vi[2] + 1;
              _fi[vi] = f.vi[2];
              f.vi[2] = iVar7;
              if (face_map == (uint *)0x0) {
                face_map = InitializeMap(mesh_vertex_count,
                                         (ON_SimpleArray<unsigned_int> *)&face_map_buffer.m_count);
              }
              face_map[(int)vertex_count1] = 0;
              face_map[iStack_144] = 0;
              face_map[f.vi[0]] = 0;
              face_map[f.vi[1]] = 0;
            }
            else {
              _fi[vi] = 0xffffffff;
            }
          }
        }
      }
      if (face_map == (uint *)0x0) {
        this_local = (ON_Mesh *)0x0;
      }
      else {
        mesh_copy._0_4_ = 0;
        for (vi = 0; vi < mesh_vertex_count; vi = vi + 1) {
          if (face_map[vi] == 0) {
            face_map[vi] = (uint)mesh_copy;
            mesh_copy._0_4_ = (uint)mesh_copy + 1;
          }
        }
        if ((uint)mesh_copy == 0) {
          this_local = (ON_Mesh *)0x0;
        }
        else {
          if (destination_mesh == (ON_Mesh *)0x0) {
            F = (ON_MeshFace *)operator_new(0x6e0);
            ON_Mesh((ON_Mesh *)F);
          }
          else {
            Destroy(destination_mesh);
            F = (ON_MeshFace *)destination_mesh;
          }
          if (f.vi[2] != 0) {
            pOVar12 = ON_SimpleArray<ON_MeshFace>::Array(&this->m_F);
            ON_SimpleArray<ON_MeshFace>::Reserve
                      ((ON_SimpleArray<ON_MeshFace> *)(F + 4),(ulong)(uint)f.vi[2]);
            bVar6 = HasFaceNormals(this);
            if (bVar6) {
              local_280 = ON_SimpleArray<ON_3fVector>::Array
                                    (&(this->m_FN).super_ON_SimpleArray<ON_3fVector>);
            }
            else {
              local_280 = (ON_3fVector *)0x0;
            }
            if (local_280 != (ON_3fVector *)0x0) {
              ON_SimpleArray<ON_3fVector>::Reserve
                        ((ON_SimpleArray<ON_3fVector> *)(F[0x14].vi + 2),(ulong)(uint)f.vi[2]);
            }
            for (local_90 = 0; local_90 < count; local_90 = local_90 + 1) {
              if (_fi[local_90] != 0xffffffff) {
                pOVar13 = pOVar12 + local_90;
                pOVar14 = ON_SimpleArray<ON_MeshFace>::AppendNew
                                    ((ON_SimpleArray<ON_MeshFace> *)(F + 4));
                pOVar14->vi[0] = face_map[(uint)pOVar13->vi[0]];
                pOVar14->vi[1] = face_map[(uint)pOVar13->vi[1]];
                pOVar14->vi[2] = face_map[(uint)pOVar13->vi[2]];
                pOVar14->vi[3] = face_map[(uint)pOVar13->vi[3]];
                if (local_280 != (ON_3fVector *)0x0) {
                  pOVar1 = local_280 + local_90;
                  pOVar15 = ON_SimpleArray<ON_3fVector>::AppendNew
                                      ((ON_SimpleArray<ON_3fVector> *)(F[0x14].vi + 2));
                  fVar5 = pOVar1->y;
                  pOVar15->x = pOVar1->x;
                  pOVar15->y = fVar5;
                  pOVar15->z = pOVar1->z;
                }
              }
            }
          }
          uVar8 = VertexUnsignedCount(this);
          uVar9 = ON_SimpleArray<ON_3fPoint>::UnsignedCount
                            (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
          if (uVar8 == uVar9) {
            local_2b0 = ON_SimpleArray<ON_3fPoint>::Array
                                  (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
          }
          else {
            local_2b0 = (ON_3fPoint *)0x0;
          }
          uVar8 = VertexUnsignedCount(this);
          uVar9 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                            (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
          if (uVar8 == uVar9) {
            local_2c8 = ON_SimpleArray<ON_3dPoint>::Array
                                  (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
          }
          else {
            local_2c8 = (ON_3dPoint *)0x0;
          }
          bVar6 = HasSurfaceParameters(this);
          if (bVar6) {
            local_2e0 = ON_SimpleArray<ON_2dPoint>::Array
                                  (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
          }
          else {
            local_2e0 = (ON_2dPoint *)0x0;
          }
          bVar6 = HasVertexNormals(this);
          if (bVar6) {
            local_2f8 = ON_SimpleArray<ON_3fVector>::Array
                                  (&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
          }
          else {
            local_2f8 = (ON_3fVector *)0x0;
          }
          bVar6 = HasTextureCoordinates(this);
          if (bVar6) {
            local_310 = ON_SimpleArray<ON_2fPoint>::Array
                                  (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
          }
          else {
            local_310 = (ON_2fPoint *)0x0;
          }
          bVar6 = HasPrincipalCurvatures(this);
          if (bVar6) {
            local_328 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
          }
          else {
            local_328 = (ON_SurfaceCurvature *)0x0;
          }
          bVar6 = HasVertexColors(this);
          if (bVar6) {
            local_340 = ON_SimpleArray<ON_Color>::Array(&this->m_C);
          }
          else {
            local_340 = (ON_Color *)0x0;
          }
          if (local_2b0 != (ON_3fPoint *)0x0) {
            ON_SimpleArray<ON_3fPoint>::Reserve
                      ((ON_SimpleArray<ON_3fPoint> *)(F[2].vi + 2),(ulong)(uint)mesh_copy);
          }
          if (local_2c8 != (ON_3dPoint *)0x0) {
            ON_SimpleArray<ON_3dPoint>::Reserve
                      ((ON_SimpleArray<ON_3dPoint> *)(F + 1),(ulong)(uint)mesh_copy);
          }
          if (local_2e0 != (ON_2dPoint *)0x0) {
            ON_SimpleArray<ON_2dPoint>::Reserve
                      ((ON_SimpleArray<ON_2dPoint> *)(F[0x22].vi + 2),(ulong)(uint)mesh_copy);
          }
          if (local_2f8 != (ON_3fVector *)0x0) {
            ON_SimpleArray<ON_3fVector>::Reserve
                      ((ON_SimpleArray<ON_3fVector> *)(F + 0x13),(ulong)(uint)mesh_copy);
          }
          if (local_310 != (ON_2fPoint *)0x0) {
            ON_SimpleArray<ON_2fPoint>::Reserve
                      ((ON_SimpleArray<ON_2fPoint> *)(F[0x1f].vi + 2),(ulong)(uint)mesh_copy);
          }
          if (local_328 != (ON_SurfaceCurvature *)0x0) {
            ON_SimpleArray<ON_SurfaceCurvature>::Reserve
                      ((ON_SimpleArray<ON_SurfaceCurvature> *)(F[0x29].vi + 2),
                       (ulong)(uint)mesh_copy);
          }
          if (local_340 != (ON_Color *)0x0) {
            ON_SimpleArray<ON_Color>::Reserve
                      ((ON_SimpleArray<ON_Color> *)(F[0x34].vi + 2),(ulong)(uint)mesh_copy);
          }
          for (ngon_buffer.m_ngon_buffer[9]._4_4_ = 0;
              ngon_buffer.m_ngon_buffer[9]._4_4_ < mesh_vertex_count;
              ngon_buffer.m_ngon_buffer[9]._4_4_ = ngon_buffer.m_ngon_buffer[9]._4_4_ + 1) {
            if (face_map[ngon_buffer.m_ngon_buffer[9]._4_4_] != 0xffffffff) {
              if (local_2b0 != (ON_3fPoint *)0x0) {
                pOVar2 = local_2b0 + ngon_buffer.m_ngon_buffer[9]._4_4_;
                pOVar16 = ON_SimpleArray<ON_3fPoint>::AppendNew
                                    ((ON_SimpleArray<ON_3fPoint> *)(F[2].vi + 2));
                fVar5 = pOVar2->y;
                pOVar16->x = pOVar2->x;
                pOVar16->y = fVar5;
                pOVar16->z = pOVar2->z;
              }
              if (local_2c8 != (ON_3dPoint *)0x0) {
                pOVar3 = local_2c8 + ngon_buffer.m_ngon_buffer[9]._4_4_;
                pOVar17 = ON_SimpleArray<ON_3dPoint>::AppendNew
                                    ((ON_SimpleArray<ON_3dPoint> *)(F + 1));
                pOVar17->x = pOVar3->x;
                pOVar17->y = pOVar3->y;
                pOVar17->z = pOVar3->z;
              }
              if (local_2e0 != (ON_2dPoint *)0x0) {
                uVar24 = (ulong)ngon_buffer.m_ngon_buffer[9]._4_4_;
                pOVar18 = ON_SimpleArray<ON_2dPoint>::AppendNew
                                    ((ON_SimpleArray<ON_2dPoint> *)(F[0x22].vi + 2));
                pOVar18->x = local_2e0[uVar24].x;
                pOVar18->y = local_2e0[uVar24].y;
              }
              if (local_2f8 != (ON_3fVector *)0x0) {
                pOVar1 = local_2f8 + ngon_buffer.m_ngon_buffer[9]._4_4_;
                pOVar15 = ON_SimpleArray<ON_3fVector>::AppendNew
                                    ((ON_SimpleArray<ON_3fVector> *)(F + 0x13));
                fVar5 = pOVar1->y;
                pOVar15->x = pOVar1->x;
                pOVar15->y = fVar5;
                pOVar15->z = pOVar1->z;
              }
              if (local_310 != (ON_2fPoint *)0x0) {
                uVar24 = (ulong)ngon_buffer.m_ngon_buffer[9]._4_4_;
                pOVar19 = ON_SimpleArray<ON_2fPoint>::AppendNew
                                    ((ON_SimpleArray<ON_2fPoint> *)(F[0x1f].vi + 2));
                *pOVar19 = local_310[uVar24];
              }
              if (local_328 != (ON_SurfaceCurvature *)0x0) {
                uVar24 = (ulong)ngon_buffer.m_ngon_buffer[9]._4_4_;
                pOVar20 = ON_SimpleArray<ON_SurfaceCurvature>::AppendNew
                                    ((ON_SimpleArray<ON_SurfaceCurvature> *)(F[0x29].vi + 2));
                pOVar20->k1 = local_328[uVar24].k1;
                pOVar20->k2 = local_328[uVar24].k2;
              }
              if (local_340 != (ON_Color *)0x0) {
                uVar24 = (ulong)ngon_buffer.m_ngon_buffer[9]._4_4_;
                paVar21 = &ON_SimpleArray<ON_Color>::AppendNew
                                     ((ON_SimpleArray<ON_Color> *)(F[0x34].vi + 2))->field_0;
                *paVar21 = local_340[uVar24].field_0;
              }
            }
          }
          uVar8 = NgonCount(this);
          for (ngon_1._0_4_ = 0; (uint)ngon_1 < uVar8; ngon_1._0_4_ = (uint)ngon_1 + 1) {
            pOVar22 = Ngon(this,(uint)ngon_1);
            if ((((pOVar22 != (ON_MeshNgon *)0x0) && (pOVar22->m_Vcount != 0)) &&
                (pOVar22->m_vi != (uint *)0x0)) &&
               ((pOVar22->m_Fcount != 0 && (pOVar22->m_fi != (uint *)0x0)))) {
              ngon1._4_4_ = 0;
              while (((ngon1._4_4_ < pOVar22->m_Vcount &&
                      (ngon_buffer.m_ngon_buffer[9]._4_4_ = pOVar22->m_vi[ngon1._4_4_],
                      ngon_buffer.m_ngon_buffer[9]._4_4_ < mesh_vertex_count)) &&
                     (face_map[ngon_buffer.m_ngon_buffer[9]._4_4_] != 0xffffffff))) {
                ngon1._4_4_ = ngon1._4_4_ + 1;
              }
              if (pOVar22->m_Vcount <= ngon1._4_4_) {
                ngon1._4_4_ = 0;
                while (((ngon1._4_4_ < pOVar22->m_Fcount && (pOVar22->m_fi[ngon1._4_4_] < count)) &&
                       (_fi[pOVar22->m_fi[ngon1._4_4_]] != 0xffffffff))) {
                  ngon1._4_4_ = ngon1._4_4_ + 1;
                }
                if (pOVar22->m_Fcount <= ngon1._4_4_) {
                  ngon_00 = AllocateNgon((ON_Mesh *)F,pOVar22->m_Vcount,pOVar22->m_Fcount);
                  ngon_00->m_Vcount = 0;
                  ngon_00->m_Fcount = 0;
                  for (ngon1._4_4_ = 0; ngon1._4_4_ < pOVar22->m_Vcount;
                      ngon1._4_4_ = ngon1._4_4_ + 1) {
                    uVar9 = face_map[pOVar22->m_vi[ngon1._4_4_]];
                    uVar4 = ngon_00->m_Vcount;
                    ngon_00->m_Vcount = uVar4 + 1;
                    ngon_00->m_vi[uVar4] = uVar9;
                  }
                  for (ngon1._4_4_ = 0; ngon1._4_4_ < pOVar22->m_Fcount;
                      ngon1._4_4_ = ngon1._4_4_ + 1) {
                    uVar9 = _fi[pOVar22->m_fi[ngon1._4_4_]];
                    uVar4 = ngon_00->m_Fcount;
                    ngon_00->m_Fcount = uVar4 + 1;
                    ngon_00->m_fi[uVar4] = uVar9;
                  }
                  AddNgon((ON_Mesh *)F,ngon_00);
                  puVar23 = NgonMap(this);
                  if (puVar23 != (uint *)0x0) {
                    CreateNgonMap((ON_Mesh *)F);
                  }
                }
              }
            }
          }
          this_local = (ON_Mesh *)F;
        }
      }
      ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)&vertex_map);
      ON_SimpleArray<unsigned_int>::~ON_SimpleArray
                ((ON_SimpleArray<unsigned_int> *)&face_map_buffer.m_count);
    }
  }
  return this_local;
}

Assistant:

ON_Mesh* ON_Mesh::CopyComponents(
  const ON_COMPONENT_INDEX* ci_list,
  size_t ci_count,
  class ON_Mesh* destination_mesh
  ) const
{
  if ( ci_count <= 0 || 0 == ci_list )
    return 0;

  const unsigned int vertex_count = m_V.UnsignedCount();
  const unsigned int face_count = m_F.UnsignedCount();

  if ( vertex_count <= 0 && face_count <= 0 )
    return 0;

  const ON_MeshTopology* top = TopologyExists() ? &Topology() : 0;
  const unsigned int topv_count = top ? top->m_topv.UnsignedCount() : 0;
  const unsigned int tope_count = top ? top->m_tope.UnsignedCount() : 0;
  
  ON_SimpleArray< unsigned int > vertex_map_buffer;
  ON_SimpleArray< unsigned int > face_map_buffer;

  unsigned int* vertex_map = 0;
  unsigned int* face_map = 0;
  unsigned int i, fi, vi;

  ON_MeshNgonBuffer ngon_buffer;
  
  for ( size_t ci_index = 0; ci_index < ci_count; ci_index++ )
  {
    ON_COMPONENT_INDEX ci = ci_list[ci_index];
    if ( !ci.IsMeshComponentIndex() )
      continue;
    if ( ci.m_index < 0 )
      continue;
    i = (unsigned int)ci.m_index;

    switch(ci.m_type)
    {
    case ON_COMPONENT_INDEX::mesh_vertex:
      if ( i >= vertex_count )
        break;
      if ( 0 == vertex_map )
        vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
      vertex_map[i] = 0;
      break;

    case ON_COMPONENT_INDEX::mesh_face:
    case ON_COMPONENT_INDEX::mesh_ngon:
      {
        const ON_MeshNgon* ngon = NgonFromComponentIndex(ngon_buffer,ci);
        if ( 0 == ngon )
          break;
        if ( 0 != ngon->m_vi )
        {
          for ( i = 0; i < ngon->m_Vcount; i++ )
          {
            vi = ngon->m_vi[i];
            if ( vi >= vertex_count )
              continue;
            if ( 0 == vertex_map )
              vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
            vertex_map[vi] = 0;
          }
        }
        if ( 0 != ngon->m_fi )
        {
          for ( i = 0; i < ngon->m_Fcount; i++ )
          {
            fi = ngon->m_fi[i];
            if ( fi >= face_count )
              continue;
            if ( 0 == face_map )
              face_map = InitializeMap(face_count,face_map_buffer);
            face_map[fi] = 0;
          }
        }
      }
      break;

    case ON_COMPONENT_INDEX::meshtop_vertex:
      if ( i < topv_count )
      {
        const ON_MeshTopologyVertex& v = top->m_topv[i];
        if ( v.m_vi )
        {
          for ( int j = 0; j < v.m_v_count; j++ )
          {
            if ( v.m_vi[j] < 0 )
              continue;
            vi = (unsigned int)v.m_vi[j];
            if ( vi < vertex_count )
            {
              if ( 0 == vertex_map )
                vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
              vertex_map[vi] = 0;
            }
          }
        }
      }
      break;

    case ON_COMPONENT_INDEX::meshtop_edge:
      if ( i < tope_count )
      {
        const ON_MeshTopologyEdge& e = top->m_tope[i];
        if ( e.m_topfi )
        {
          for ( int j = 0; j < e.m_topf_count; j++ )
          {
            if ( e.m_topfi[j] < 0 )
              continue;
            fi = (unsigned int)e.m_topfi[j];
            if ( fi >= face_count )
              continue;
            if ( 0 == face_map )
              face_map = InitializeMap(face_count,face_map_buffer);
            face_map[fi] = 0;
          }
        }
      }
      break;

    default:
      break;
    }
  }

  unsigned int face_count1 = 0;
  if ( 0 != face_map )
  {
    for ( i = 0; i < face_count; i++ )
    {
      if ( 0 == face_map[i] )
      {
        ON_MeshFace f = m_F[i];
        if ( f.IsValid(vertex_count) )
        {
          face_map[i] = face_count1++;
          if ( 0 == vertex_map )
            vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
          vertex_map[f.vi[0]] = 0;
          vertex_map[f.vi[1]] = 0;
          vertex_map[f.vi[2]] = 0;
          vertex_map[f.vi[3]] = 0;
        }
        else
          face_map[i] = ON_UNSET_UINT_INDEX; // bogus input face
      }
    }
  }

  if ( 0 == vertex_map )
    return 0;

  unsigned int vertex_count1 = 0;
  for ( i = 0; i < vertex_count; i++ )
  {
    if ( 0 == vertex_map[i] )
      vertex_map[i] = vertex_count1++;
  }

  if ( vertex_count1 <= 0 )
    return 0;

  ON_Mesh* mesh_copy = 0;
  if ( destination_mesh )
  {
    destination_mesh->Destroy();
    mesh_copy = destination_mesh;
  }
  else
  {
    mesh_copy = new ON_Mesh();
  }

  if ( face_count1 > 0 )
  {
    // copy face information
    const ON_MeshFace* F = m_F.Array();
    mesh_copy->m_F.Reserve(face_count1);
    const ON_3fVector* FN = HasFaceNormals() ? m_FN.Array() : 0;
    if ( 0 != FN )
      mesh_copy->m_FN.Reserve(face_count1);
    const unsigned int* fvi;
    unsigned int* fvi1;
    for ( fi = 0; fi < face_count; fi++ )
    {
      if ( ON_UNSET_UINT_INDEX == face_map[fi] )
        continue;
      fvi = (const unsigned int*)F[fi].vi;
      fvi1 = (unsigned int*)(mesh_copy->m_F.AppendNew().vi);
      fvi1[0] = vertex_map[fvi[0]];
      fvi1[1] = vertex_map[fvi[1]];
      fvi1[2] = vertex_map[fvi[2]];
      fvi1[3] = vertex_map[fvi[3]];
      if ( FN )
        mesh_copy->m_FN.AppendNew() = FN[fi];
    }
  }

  const bool bValidSingles = (VertexUnsignedCount() == m_V.UnsignedCount());
  const ON_3fPoint* fV = bValidSingles ? m_V.Array() : nullptr;
  const bool bValidDoubles = (VertexUnsignedCount() == m_dV.UnsignedCount());
  const ON_3dPoint* dV = bValidDoubles ? m_dV.Array() : nullptr;
  const ON_2dPoint* S = HasSurfaceParameters() ? m_S.Array() : 0;
  const ON_3fVector* N = HasVertexNormals() ? m_N.Array() : 0;
  const ON_2fPoint* T = HasTextureCoordinates() ? m_T.Array() : 0;
  const ON_SurfaceCurvature* K = HasPrincipalCurvatures() ? m_K.Array() : 0;
  const ON_Color* C = HasVertexColors() ? m_C.Array() : 0;

  if (fV)
    mesh_copy->m_V.Reserve(vertex_count1);
  if (dV)
    mesh_copy->m_dV.Reserve(vertex_count1);
  if (S)
    mesh_copy->m_S.Reserve(vertex_count1);
  if (N)
    mesh_copy->m_N.Reserve(vertex_count1);
  if (T)
    mesh_copy->m_T.Reserve(vertex_count1);
  if (K)
    mesh_copy->m_K.Reserve(vertex_count1);
  if (C)
    mesh_copy->m_C.Reserve(vertex_count1);

  for ( vi = 0; vi < vertex_count; vi++ )
  {
    if ( ON_UNSET_UINT_INDEX == vertex_map[vi] )
      continue;
    if (fV)
      mesh_copy->m_V.AppendNew() = fV[vi];
    if (dV)
      mesh_copy->m_dV.AppendNew() = dV[vi];
    if ( S )
      mesh_copy->m_S.AppendNew() = S[vi];
    if ( N )
      mesh_copy->m_N.AppendNew() = N[vi];
    if ( T )
      mesh_copy->m_T.AppendNew() = T[vi];
    if ( K )
      mesh_copy->m_K.AppendNew() = K[vi];
    if ( C )
      mesh_copy->m_C.AppendNew() = C[vi];
  }

  const unsigned int ngon_count = NgonCount();
  for ( unsigned int ngon_index = 0; ngon_index < ngon_count; ngon_index++ )
  {
    const ON_MeshNgon* ngon = Ngon(ngon_index);
    if ( 0 == ngon )
      continue;
    if ( 0 == ngon->m_Vcount || 0 == ngon->m_vi )
      continue;
    if ( 0 == ngon->m_Fcount || 0 == ngon->m_fi )
      continue;
    
    unsigned int j;
    
    for ( j = 0; j < ngon->m_Vcount; j++ )
    {
      vi = ngon->m_vi[j];
      if ( vi >= vertex_count )
        break;
      if ( ON_UNSET_UINT_INDEX == vertex_map[vi] )
        break;
    }
    if ( j < ngon->m_Vcount )
      continue;

    for ( j = 0; j < ngon->m_Fcount; j++ )
    {
      fi = ngon->m_fi[j];
      if ( fi >= face_count )
        break;
      if ( ON_UNSET_UINT_INDEX == face_map[fi] )
        break;
    }
    if ( j < ngon->m_Fcount )
      continue;

    ON_MeshNgon* ngon1 = mesh_copy->AllocateNgon(ngon->m_Vcount,ngon->m_Fcount);

    ngon1->m_Vcount = 0;
    ngon1->m_Fcount = 0;
    for ( j = 0; j < ngon->m_Vcount; j++ )
    {
      ngon1->m_vi[ngon1->m_Vcount++] = vertex_map[ngon->m_vi[j]];
    }
    for ( j = 0; j < ngon->m_Fcount; j++ )
    {
      ngon1->m_fi[ngon1->m_Fcount++] = face_map[ngon->m_fi[j]];
    }

    mesh_copy->AddNgon(ngon1);

    if ( 0 != NgonMap() )
      mesh_copy->CreateNgonMap();
  }

  return mesh_copy;
}